

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_19(QPDF *pdf,char *arg2)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  QPDFObjectHandle QVar5;
  value_type newpage;
  value_type last;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  plVar1 = (long *)QPDF::getAllPages();
  lVar2 = *plVar1;
  uVar4 = plVar1[1] - lVar2 >> 4;
  if (uVar4 < 6) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5,uVar4);
    goto LAB_0011ae96;
  }
  local_a8 = *(undefined8 *)(lVar2 + 0x50);
  local_90 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x58);
  if (local_90 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_a0 = local_90;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_90->_M_use_count = local_90->_M_use_count + 1;
      UNLOCK();
      uVar4 = plVar1[1] - *plVar1 >> 4;
      if (local_90 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0011acf6;
    }
    else {
      local_90->_M_use_count = local_90->_M_use_count + 1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_90->_M_use_count = local_90->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_90->_M_use_count = local_90->_M_use_count + 1;
    }
  }
LAB_0011acf6:
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  local_98 = local_a8;
  QPDF::addPage(QVar5,false);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  local_88 = *(undefined8 *)(plVar1[1] + -0x10);
  local_80 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar1[1] + -8);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_80->_M_use_count = local_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_80->_M_use_count = local_80->_M_use_count + 1;
    }
  }
  if (plVar1[1] - *plVar1 >> 4 == uVar4 + 1) {
    lVar2 = QPDFObjectHandle::getObjGen();
    lVar3 = QPDFObjectHandle::getObjGen();
    if (lVar2 == lVar3) {
      __assert_fail("!(last.getObjGen() == newpage.getObjGen())",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x33b,"void test_19(QPDF &, const char *)");
    }
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"/Contents","");
    QPDFObjectHandle::getKey(local_68);
    lVar2 = QPDFObjectHandle::getObjGen();
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"/Contents","");
    QPDFObjectHandle::getKey(local_78);
    lVar3 = QPDFObjectHandle::getObjGen();
    if (lVar2 == lVar3) {
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      return;
    }
    __assert_fail("last.getKey(\"/Contents\").getObjGen() == newpage.getKey(\"/Contents\").getObjGen()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x33c,"void test_19(QPDF &, const char *)");
  }
LAB_0011ae96:
  __assert_fail("pages.size() == count + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x33a,"void test_19(QPDF &, const char *)");
}

Assistant:

static void
test_19(QPDF& pdf, char const* arg2)
{
    // Remove a page and re-insert it in the same file.
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();

    // Try to insert a page that's already there. A shallow copy
    // gets inserted instead.
    auto newpage = pages.at(5);
    size_t count = pages.size();
    pdf.addPage(newpage, false);
    auto last = pages.back();
    assert(pages.size() == count + 1);
    assert(!(last.getObjGen() == newpage.getObjGen()));
    assert(last.getKey("/Contents").getObjGen() == newpage.getKey("/Contents").getObjGen());
}